

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void tmvline4_revsubclamp(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DWORD b;
  DWORD a;
  BYTE pix;
  int i;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int bits;
  int count;
  BYTE *dest;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  _bits = dc_dest;
  fg2rgb._4_4_ = dc_count;
  do {
    for (a = 0; (int)a < 4; a = a + 1) {
      if (bufplce[(int)a][vplce[(int)a] >> ((byte)iVar3 & 0x1f)] != 0) {
        uVar4 = (pDVar2[_bits[(int)a]] | 0x40100400) -
                pDVar1[palookupoffse[(int)a][bufplce[(int)a][vplce[(int)a] >> ((byte)iVar3 & 0x1f)]]
                      ];
        uVar5 = uVar4 & 0x40100400;
        uVar4 = uVar5 - (uVar5 >> 5) & uVar4 | 0x1f07c1f;
        _bits[(int)a] = RGB32k.All[uVar4 & uVar4 >> 0xf];
      }
      vplce[(int)a] = vince[(int)a] + vplce[(int)a];
    }
    _bits = _bits + dc_pitch;
    fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
  } while (fg2rgb._4_4_ != 0);
  return;
}

Assistant:

void tmvline4_revsubclamp ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD a = (bg2rgb[dest[i]] | 0x40100400) - fg2rgb[palookupoffse[i][pix]];
				DWORD b = a;

				b &= 0x40100400;
				b = b - (b >> 5);
				a &= b;
				a |= 0x01f07c1f;
				dest[i] = RGB32k.All[a & (a>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}